

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_no_field_presence.pb.cc
# Opt level: O0

size_t __thiscall
proto2_nofieldpresence_unittest::TestAllMapTypes::ByteSizeLong(TestAllMapTypes *this)

{
  bool bVar1;
  int iVar2;
  Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  reference key;
  size_t sVar3;
  Map<int,_proto2_nofieldpresence_unittest::ForeignEnum> *this_01;
  reference key_00;
  Map<int,_proto2_nofieldpresence_unittest::ForeignMessage> *this_02;
  reference key_01;
  Map<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage> *this_03;
  reference key_02;
  value_type *entry_3;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  Map<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage> *__range2_3;
  value_type *entry_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  Map<int,_proto2_nofieldpresence_unittest::ForeignMessage> *__range2_2;
  value_type *entry_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  Map<int,_proto2_nofieldpresence_unittest::ForeignEnum> *__range2_1;
  value_type *entry;
  const_iterator __end2;
  const_iterator __begin2;
  Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range2;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  TestAllMapTypes *this_;
  TestAllMapTypes *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  iVar2 = _internal_map_int32_bytes_size(this);
  sStack_58 = google::protobuf::internal::FromIntSize(iVar2);
  this_00 = _internal_map_int32_bytes_abi_cxx11_(this);
  google::protobuf::
  Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::begin
            ((const_iterator *)&__end2.super_UntypedMapIterator.bucket_index_,this_00);
  google::protobuf::
  Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::end
            ((const_iterator *)&entry,this_00);
  while( true ) {
    bVar1 = google::protobuf::operator!=
                      ((const_iterator *)&__end2.super_UntypedMapIterator.bucket_index_,
                       (const_iterator *)&entry);
    if (!bVar1) break;
    key = google::protobuf::
          Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::const_iterator::operator*
                    ((const_iterator *)&__end2.super_UntypedMapIterator.bucket_index_);
    sVar3 = google::protobuf::internal::
            MapEntryFuncs<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)12>
            ::ByteSizeLong(&key->first,&key->second);
    sStack_58 = sVar3 + sStack_58;
    google::protobuf::
    Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    const_iterator::operator++((const_iterator *)&__end2.super_UntypedMapIterator.bucket_index_);
  }
  iVar2 = _internal_map_int32_foreign_enum_size(this);
  sVar3 = google::protobuf::internal::FromIntSize(iVar2);
  sStack_58 = sVar3 + sStack_58;
  this_01 = _internal_map_int32_foreign_enum(this);
  google::protobuf::Map<int,_proto2_nofieldpresence_unittest::ForeignEnum>::begin
            ((const_iterator *)&__end2_1.super_UntypedMapIterator.bucket_index_,this_01);
  google::protobuf::Map<int,_proto2_nofieldpresence_unittest::ForeignEnum>::end
            ((const_iterator *)&entry_1,this_01);
  while( true ) {
    bVar1 = google::protobuf::operator!=
                      ((const_iterator *)&__end2_1.super_UntypedMapIterator.bucket_index_,
                       (const_iterator *)&entry_1);
    if (!bVar1) break;
    key_00 = google::protobuf::Map<int,_proto2_nofieldpresence_unittest::ForeignEnum>::
             const_iterator::operator*
                       ((const_iterator *)&__end2_1.super_UntypedMapIterator.bucket_index_);
    sVar3 = google::protobuf::internal::
            MapEntryFuncs<int,_proto2_nofieldpresence_unittest::ForeignEnum,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)14>
            ::ByteSizeLong(&key_00->first,&key_00->second);
    sStack_58 = sVar3 + sStack_58;
    google::protobuf::Map<int,_proto2_nofieldpresence_unittest::ForeignEnum>::const_iterator::
    operator++((const_iterator *)&__end2_1.super_UntypedMapIterator.bucket_index_);
  }
  iVar2 = _internal_map_int32_foreign_message_size(this);
  sVar3 = google::protobuf::internal::FromIntSize(iVar2);
  sStack_58 = sVar3 + sStack_58;
  this_02 = _internal_map_int32_foreign_message(this);
  google::protobuf::Map<int,_proto2_nofieldpresence_unittest::ForeignMessage>::begin
            ((const_iterator *)&__end2_2.super_UntypedMapIterator.bucket_index_,this_02);
  google::protobuf::Map<int,_proto2_nofieldpresence_unittest::ForeignMessage>::end
            ((const_iterator *)&entry_2,this_02);
  while( true ) {
    bVar1 = google::protobuf::operator!=
                      ((const_iterator *)&__end2_2.super_UntypedMapIterator.bucket_index_,
                       (const_iterator *)&entry_2);
    if (!bVar1) break;
    key_01 = google::protobuf::Map<int,_proto2_nofieldpresence_unittest::ForeignMessage>::
             const_iterator::operator*
                       ((const_iterator *)&__end2_2.super_UntypedMapIterator.bucket_index_);
    sVar3 = google::protobuf::internal::
            MapEntryFuncs<int,_proto2_nofieldpresence_unittest::ForeignMessage,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)11>
            ::ByteSizeLong(&key_01->first,&key_01->second);
    sStack_58 = sVar3 + sStack_58;
    google::protobuf::Map<int,_proto2_nofieldpresence_unittest::ForeignMessage>::const_iterator::
    operator++((const_iterator *)&__end2_2.super_UntypedMapIterator.bucket_index_);
  }
  iVar2 = _internal_map_int32_explicit_foreign_message_size(this);
  sVar3 = google::protobuf::internal::FromIntSize(iVar2);
  sStack_58 = sVar3 + sStack_58;
  this_03 = _internal_map_int32_explicit_foreign_message(this);
  google::protobuf::Map<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage>::begin
            ((const_iterator *)&__end2_3.super_UntypedMapIterator.bucket_index_,this_03);
  google::protobuf::Map<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage>::end
            ((const_iterator *)&entry_3,this_03);
  while( true ) {
    bVar1 = google::protobuf::operator!=
                      ((const_iterator *)&__end2_3.super_UntypedMapIterator.bucket_index_,
                       (const_iterator *)&entry_3);
    if (!bVar1) break;
    key_02 = google::protobuf::Map<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage>::
             const_iterator::operator*
                       ((const_iterator *)&__end2_3.super_UntypedMapIterator.bucket_index_);
    sVar3 = google::protobuf::internal::
            MapEntryFuncs<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)11>
            ::ByteSizeLong(&key_02->first,&key_02->second);
    sStack_58 = sVar3 + sStack_58;
    google::protobuf::Map<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage>::
    const_iterator::operator++((const_iterator *)&__end2_3.super_UntypedMapIterator.bucket_index_);
  }
  sVar3 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t TestAllMapTypes::ByteSizeLong() const {
  const TestAllMapTypes& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_nofieldpresence_unittest.TestAllMapTypes)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // map<int32, bytes> map_int32_bytes = 1;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_map_int32_bytes_size());
      for (const auto& entry : this_._internal_map_int32_bytes()) {
        total_size += _pbi::MapEntryFuncs<::int32_t, std::string,
                                       _pbi::WireFormatLite::TYPE_INT32,
                                       _pbi::WireFormatLite::TYPE_BYTES>::ByteSizeLong(entry.first, entry.second);
      }
    }
    // map<int32, .proto2_nofieldpresence_unittest.ForeignEnum> map_int32_foreign_enum = 2;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_map_int32_foreign_enum_size());
      for (const auto& entry : this_._internal_map_int32_foreign_enum()) {
        total_size += _pbi::MapEntryFuncs<::int32_t, ::proto2_nofieldpresence_unittest::ForeignEnum,
                                       _pbi::WireFormatLite::TYPE_INT32,
                                       _pbi::WireFormatLite::TYPE_ENUM>::ByteSizeLong(entry.first, entry.second);
      }
    }
    // map<int32, .proto2_nofieldpresence_unittest.ForeignMessage> map_int32_foreign_message = 3;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_map_int32_foreign_message_size());
      for (const auto& entry : this_._internal_map_int32_foreign_message()) {
        total_size += _pbi::MapEntryFuncs<::int32_t, ::proto2_nofieldpresence_unittest::ForeignMessage,
                                       _pbi::WireFormatLite::TYPE_INT32,
                                       _pbi::WireFormatLite::TYPE_MESSAGE>::ByteSizeLong(entry.first, entry.second);
      }
    }
    // map<int32, .proto2_nofieldpresence_unittest.ExplicitForeignMessage> map_int32_explicit_foreign_message = 4;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_map_int32_explicit_foreign_message_size());
      for (const auto& entry : this_._internal_map_int32_explicit_foreign_message()) {
        total_size += _pbi::MapEntryFuncs<::int32_t, ::proto2_nofieldpresence_unittest::ExplicitForeignMessage,
                                       _pbi::WireFormatLite::TYPE_INT32,
                                       _pbi::WireFormatLite::TYPE_MESSAGE>::ByteSizeLong(entry.first, entry.second);
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}